

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O1

void idct64_stage11_avx2(__m256i *u,__m256i *out,int do_cols,int bd,int out_shift,__m256i *clamp_lo,
                        __m256i *clamp_hi)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  undefined1 auVar7 [32];
  int iVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  __m256i clamp_lo_out;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  int local_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  
  lVar9 = 0x7e0;
  lVar10 = 0;
  do {
    auVar1 = *(undefined1 (*) [32])((long)*u + lVar10);
    auVar2 = *(undefined1 (*) [32])((long)*u + lVar9);
    auVar3 = vpaddd_avx2(auVar2,auVar1);
    auVar7 = vpsubd_avx2(auVar1,auVar2);
    auVar1 = vpmaxsd_avx2(auVar3,(undefined1  [32])*clamp_lo);
    auVar2 = vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    auVar1 = vpmaxsd_avx2(auVar7,(undefined1  [32])*clamp_lo);
    auVar1 = vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    *(undefined1 (*) [32])((long)*out + lVar10) = auVar2;
    *(undefined1 (*) [32])((long)*out + lVar9) = auVar1;
    lVar9 = lVar9 + -0x20;
    lVar10 = lVar10 + 0x20;
  } while (lVar9 != 0x3e0);
  if (do_cols == 0) {
    iVar8 = 10;
    if (10 < bd) {
      iVar8 = bd;
    }
    local_80 = 0x20 << ((byte)iVar8 & 0x1f);
    local_60 = -local_80;
    local_80 = local_80 + -1;
    if (out_shift != 0) {
      iVar8 = 1 << ((char)out_shift - 1U & 0x1f);
      auVar12._4_4_ = iVar8;
      auVar12._0_4_ = iVar8;
      auVar12._8_4_ = iVar8;
      auVar12._12_4_ = iVar8;
      auVar12._16_4_ = iVar8;
      auVar12._20_4_ = iVar8;
      auVar12._24_4_ = iVar8;
      auVar12._28_4_ = iVar8;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])*out);
      auVar2 = vpaddd_avx2(auVar12,(undefined1  [32])out[1]);
      auVar3 = vpaddd_avx2(auVar12,(undefined1  [32])out[2]);
      auVar7 = vpaddd_avx2(auVar12,(undefined1  [32])out[3]);
      alVar5 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)out_shift));
      *out = alVar5;
      alVar5 = (__m256i)vpsrad_avx2(auVar2,ZEXT416((uint)out_shift));
      out[1] = alVar5;
      auVar11 = ZEXT416((uint)out_shift);
      alVar5 = (__m256i)vpsrad_avx2(auVar3,auVar11);
      alVar6 = (__m256i)vpsrad_avx2(auVar7,auVar11);
      out[2] = alVar5;
      out[3] = alVar6;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])out[4]);
      auVar2 = vpaddd_avx2(auVar12,(undefined1  [32])out[5]);
      auVar3 = vpaddd_avx2(auVar12,(undefined1  [32])out[6]);
      auVar7 = vpaddd_avx2(auVar12,(undefined1  [32])out[7]);
      alVar5 = (__m256i)vpsrad_avx2(auVar1,auVar11);
      out[4] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar11);
      out[5] = alVar5;
      auVar11 = ZEXT416((uint)out_shift);
      alVar5 = (__m256i)vpsrad_avx2(auVar3,auVar11);
      alVar6 = (__m256i)vpsrad_avx2(auVar7,auVar11);
      out[6] = alVar5;
      out[7] = alVar6;
      alVar5 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[8]);
      out[8] = alVar5;
      alVar6 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[9]);
      out[9] = alVar6;
      alVar4 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[10]);
      out[10] = alVar4;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])out[0xb]);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar5,auVar11);
      out[8] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar6,auVar11);
      out[9] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar11);
      alVar6 = (__m256i)vpsrad_avx2(auVar1,auVar11);
      out[10] = alVar5;
      out[0xb] = alVar6;
      alVar5 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0xc]);
      out[0xc] = alVar5;
      alVar6 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0xd]);
      out[0xd] = alVar6;
      alVar4 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0xe]);
      out[0xe] = alVar4;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])out[0xf]);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar5,auVar11);
      out[0xc] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar6,auVar11);
      out[0xd] = alVar5;
      auVar11 = ZEXT416((uint)out_shift);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar11);
      alVar6 = (__m256i)vpsrad_avx2(auVar1,auVar11);
      out[0xe] = alVar5;
      out[0xf] = alVar6;
      alVar5 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x10]);
      out[0x10] = alVar5;
      alVar6 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x11]);
      out[0x11] = alVar6;
      alVar4 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x12]);
      out[0x12] = alVar4;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])out[0x13]);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar5,auVar11);
      out[0x10] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar6,auVar11);
      out[0x11] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar11);
      alVar6 = (__m256i)vpsrad_avx2(auVar1,auVar11);
      out[0x12] = alVar5;
      out[0x13] = alVar6;
      alVar5 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x14]);
      out[0x14] = alVar5;
      alVar6 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x15]);
      out[0x15] = alVar6;
      alVar4 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x16]);
      out[0x16] = alVar4;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])out[0x17]);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar5,auVar11);
      out[0x14] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar6,auVar11);
      out[0x15] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar11);
      alVar6 = (__m256i)vpsrad_avx2(auVar1,auVar11);
      out[0x16] = alVar5;
      out[0x17] = alVar6;
      alVar5 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x18]);
      out[0x18] = alVar5;
      alVar6 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x19]);
      out[0x19] = alVar6;
      alVar4 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x1a]);
      out[0x1a] = alVar4;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])out[0x1b]);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar5,auVar11);
      out[0x18] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar6,auVar11);
      out[0x19] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar11);
      alVar6 = (__m256i)vpsrad_avx2(auVar1,auVar11);
      out[0x1a] = alVar5;
      out[0x1b] = alVar6;
      alVar5 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x1c]);
      out[0x1c] = alVar5;
      alVar6 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x1d]);
      out[0x1d] = alVar6;
      alVar4 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x1e]);
      out[0x1e] = alVar4;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])out[0x1f]);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar5,auVar11);
      out[0x1c] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar6,auVar11);
      out[0x1d] = alVar5;
      auVar11 = ZEXT416((uint)out_shift);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar11);
      alVar6 = (__m256i)vpsrad_avx2(auVar1,auVar11);
      out[0x1e] = alVar5;
      out[0x1f] = alVar6;
      alVar5 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x20]);
      out[0x20] = alVar5;
      alVar6 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x21]);
      out[0x21] = alVar6;
      alVar4 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x22]);
      out[0x22] = alVar4;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])out[0x23]);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar5,auVar11);
      out[0x20] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar6,auVar11);
      out[0x21] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar11);
      alVar6 = (__m256i)vpsrad_avx2(auVar1,auVar11);
      out[0x22] = alVar5;
      out[0x23] = alVar6;
      alVar5 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x24]);
      out[0x24] = alVar5;
      alVar6 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x25]);
      out[0x25] = alVar6;
      alVar4 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x26]);
      out[0x26] = alVar4;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])out[0x27]);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar5,auVar11);
      out[0x24] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar6,auVar11);
      out[0x25] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar11);
      alVar6 = (__m256i)vpsrad_avx2(auVar1,auVar11);
      out[0x26] = alVar5;
      out[0x27] = alVar6;
      alVar5 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x28]);
      out[0x28] = alVar5;
      alVar6 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x29]);
      out[0x29] = alVar6;
      alVar4 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x2a]);
      out[0x2a] = alVar4;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])out[0x2b]);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar5,auVar11);
      out[0x28] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar6,auVar11);
      out[0x29] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar11);
      alVar6 = (__m256i)vpsrad_avx2(auVar1,auVar11);
      out[0x2a] = alVar5;
      out[0x2b] = alVar6;
      alVar5 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x2c]);
      out[0x2c] = alVar5;
      alVar6 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x2d]);
      out[0x2d] = alVar6;
      alVar4 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x2e]);
      out[0x2e] = alVar4;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])out[0x2f]);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar5,auVar11);
      out[0x2c] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar6,auVar11);
      out[0x2d] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar11);
      alVar6 = (__m256i)vpsrad_avx2(auVar1,auVar11);
      out[0x2e] = alVar5;
      out[0x2f] = alVar6;
      alVar5 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x30]);
      out[0x30] = alVar5;
      alVar6 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x31]);
      out[0x31] = alVar6;
      alVar4 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x32]);
      out[0x32] = alVar4;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])out[0x33]);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar5,auVar11);
      out[0x30] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar6,auVar11);
      out[0x31] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar11);
      alVar6 = (__m256i)vpsrad_avx2(auVar1,auVar11);
      out[0x32] = alVar5;
      out[0x33] = alVar6;
      alVar5 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x34]);
      out[0x34] = alVar5;
      alVar6 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x35]);
      out[0x35] = alVar6;
      alVar4 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x36]);
      out[0x36] = alVar4;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])out[0x37]);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar5,auVar11);
      out[0x34] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar6,auVar11);
      out[0x35] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar11);
      alVar6 = (__m256i)vpsrad_avx2(auVar1,auVar11);
      out[0x36] = alVar5;
      out[0x37] = alVar6;
      alVar5 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x38]);
      out[0x38] = alVar5;
      alVar6 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x39]);
      out[0x39] = alVar6;
      alVar4 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x3a]);
      out[0x3a] = alVar4;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])out[0x3b]);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar5,auVar11);
      out[0x38] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar6,auVar11);
      out[0x39] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,auVar11);
      alVar6 = (__m256i)vpsrad_avx2(auVar1,auVar11);
      out[0x3a] = alVar5;
      out[0x3b] = alVar6;
      alVar5 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x3c]);
      out[0x3c] = alVar5;
      alVar6 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x3d]);
      out[0x3d] = alVar6;
      alVar4 = (__m256i)vpaddd_avx2(auVar12,(undefined1  [32])out[0x3e]);
      out[0x3e] = alVar4;
      auVar1 = vpaddd_avx2(auVar12,(undefined1  [32])out[0x3f]);
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar5,auVar11);
      alVar6 = (__m256i)vpsrad_avx2((undefined1  [32])alVar6,auVar11);
      out[0x3c] = alVar5;
      out[0x3d] = alVar6;
      alVar5 = (__m256i)vpsrad_avx2((undefined1  [32])alVar4,ZEXT416((uint)out_shift));
      out[0x3e] = alVar5;
      alVar5 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)out_shift));
      out[0x3f] = alVar5;
    }
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    iStack_5c = local_60;
    iStack_58 = local_60;
    iStack_54 = local_60;
    iStack_50 = local_60;
    iStack_4c = local_60;
    iStack_48 = local_60;
    iStack_44 = local_60;
    highbd_clamp_epi32_avx2(out,out,(__m256i *)&local_60,(__m256i *)&local_80,0x40);
  }
  return;
}

Assistant:

static inline void idct64_stage11_avx2(__m256i *u, __m256i *out, int do_cols,
                                       int bd, int out_shift,
                                       const __m256i *clamp_lo,
                                       const __m256i *clamp_hi) {
  for (int i = 0; i < 32; i++) {
    addsub_avx2(u[i], u[63 - i], &out[(i)], &out[(63 - i)], clamp_lo, clamp_hi);
  }

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

    round_shift_8x8_avx2(out, out_shift);
    round_shift_8x8_avx2(out + 16, out_shift);
    round_shift_8x8_avx2(out + 32, out_shift);
    round_shift_8x8_avx2(out + 48, out_shift);
    highbd_clamp_epi32_avx2(out, out, &clamp_lo_out, &clamp_hi_out, 64);
  }
}